

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFilter.cpp
# Opt level: O1

void __thiscall
KFilter::KFilter(KFilter *this,MatrixXd *F,VectorXd *x,MatrixXd *P,MatrixXd *Q,MatrixXd *H,
                MatrixXd *R)

{
  DenseStorage<double,__1,__1,_1,_0> local_b8;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  DenseStorage<double,__1,__1,__1,_0> local_90;
  DenseStorage<double,__1,__1,__1,_0> local_78;
  DenseStorage<double,__1,__1,__1,_0> local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  memset(this,0,0x88);
  this->state_dimension_ =
       (int)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  this->measurement_dimension_ =
       (int)(R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)F);
  setStateTransition(this,(MatrixXd *)&local_48);
  free(local_48.m_data);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_b8,(DenseStorage<double,__1,__1,_1,_0> *)x);
  setInitialState(this,(VectorXd *)&local_b8);
  free(local_b8.m_data);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_60,(DenseStorage<double,__1,__1,__1,_0> *)P);
  setCovariance(this,(MatrixXd *)&local_60);
  free(local_60.m_data);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_78,(DenseStorage<double,__1,__1,__1,_0> *)Q);
  setProcessNoise(this,(MatrixXd *)&local_78);
  free(local_78.m_data);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_90,(DenseStorage<double,__1,__1,__1,_0> *)H);
  setMeasurementFunction(this,(MatrixXd *)&local_90);
  free(local_90.m_data);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_a8,(DenseStorage<double,__1,__1,__1,_0> *)R);
  setMeasurementNoise(this,(MatrixXd *)&local_a8);
  free(local_a8.m_data);
  return;
}

Assistant:

KFilter::KFilter(MatrixXd F,
                 VectorXd x,
                 MatrixXd P,
                 MatrixXd Q,
                 MatrixXd H,
                 MatrixXd R)
{
    state_dimension_ = x.rows();
    measurement_dimension_ = R.rows();
    // Use these functions instead of direct set so we can check dimensions
    setStateTransition(F);
    setInitialState(x);
    setCovariance(P);
    setProcessNoise(Q);
    setMeasurementFunction(H);
    setMeasurementNoise(R);
}